

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iraffits.c
# Opt level: O2

int iraf2mem(char *filename,char **buffptr,size_t *buffsize,size_t *filesize,int *status)

{
  char cVar1;
  short sVar2;
  short sVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [11];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  bool bVar22;
  char **ppcVar23;
  int iVar24;
  int iVar25;
  uint uVar26;
  int iVar27;
  int iVar28;
  char *pcVar29;
  long lVar30;
  char *pcVar31;
  FILE *__stream;
  char *pcVar32;
  size_t sVar33;
  char *pcVar34;
  char *pcVar35;
  long lVar36;
  size_t sVar37;
  int extraout_EDX;
  int extraout_EDX_00;
  int nc;
  int nc_00;
  int extraout_EDX_01;
  int extraout_EDX_02;
  char *pcVar38;
  int iVar39;
  uint uVar40;
  ulong uVar41;
  ulong *string;
  ulong *puVar42;
  bool bVar43;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  int naxis2;
  ulong local_200;
  size_t *local_1f8;
  size_t local_1f0;
  int *local_1e8;
  int lpixhead;
  int npaxis1;
  int naxis3;
  int naxis1;
  ulong *local_1d0;
  char **local_1c8;
  uint local_1bc;
  int lenirafhead;
  int bitpix;
  int naxis4;
  int nax;
  char *local_1a8;
  int npaxis2;
  char local_198 [96];
  char pixname [256];
  
  *buffptr = (char *)0x0;
  *buffsize = 0;
  *filesize = 0;
  local_1d0 = buffsize;
  pcVar29 = irafrdhead(filename,&lenirafhead);
  if (pcVar29 == (char *)0x0) {
    *status = 0x68;
    return 0x68;
  }
  iVar27 = 0x68;
  pixname[0] = 'E';
  pixname[1] = 'N';
  pixname[2] = 'D';
  for (lVar30 = 3; lVar30 != 0x50; lVar30 = lVar30 + 1) {
    pixname[lVar30] = ' ';
  }
  local_1c8 = buffptr;
  iVar24 = head_version(pcVar29);
  if (iVar24 == 0) {
    ffpmsg("File not valid IRAF image header");
    ffpmsg(filename);
    *status = 0x68;
  }
  else {
    iVar25 = lenirafhead + -0x7fe;
    bVar43 = iVar24 != 2;
    iVar28 = 0xa2;
    if (!bVar43) {
      iVar28 = 0x51;
    }
    lVar30 = 10;
    if (bVar43) {
      iVar25 = lenirafhead + -0x804;
      lVar30 = 0x10;
    }
    local_200 = CONCAT71(local_200._1_7_,bVar43);
    iVar25 = (iVar25 / iVar28) * 0x50 + 0x780;
    uVar40 = (iVar25 - iVar25 % 0xb40) + 0x3844;
    *local_1d0 = (long)(int)uVar40;
    local_1f8 = filesize;
    local_1e8 = status;
    pcVar31 = (char *)calloc((long)(int)uVar40,1);
    if (pcVar31 == (char *)0x0) {
      snprintf(local_198,0x51,"IRAF2FITS Cannot allocate %d-byte FITS header",(ulong)uVar40);
      ffpmsg(filename);
      status = local_1e8;
    }
    else {
      *local_1c8 = pcVar31;
      strncpy(pcVar31,pixname,0x50);
      local_1a8 = pcVar31;
      hputl(pcVar31,"SIMPLE",1);
      uVar40 = (uint)(pcVar29[lVar30] != '\0');
      local_1f0 = CONCAT44(local_1f0._4_4_,iVar24);
      swaphead = uVar40;
      if (iVar24 != 1) {
        uVar40 = irafgeti4(pcVar29,0xe);
      }
      swapdata = uVar40;
      uVar26 = irafgeti4(pcVar29,(int)lVar30);
      pcVar31 = local_1a8;
      status = local_1e8;
      uVar40 = uVar26 - 2;
      if ((uVar40 < 0xb) && ((0x63fU >> (uVar40 & 0x1f) & 1) != 0)) {
        uVar26 = (uint)(byte)local_200;
        local_200 = (ulong)uVar26;
        iVar27 = uVar26 * 2;
        hputi4(local_1a8,"BITPIX",*(int *)(&DAT_0020c8c0 + (ulong)uVar40 * 4));
        hputcom(pcVar31,"BITPIX","IRAF .imh pixel type");
        uVar40 = irafgeti4(pcVar29,uVar26 * 2 + 0x12);
        hputi4(pcVar31,"NAXIS",uVar40);
        hputcom(pcVar31,"NAXIS","IRAF .imh naxis");
        iVar24 = irafgeti4(pcVar29,iVar27 + 0x16);
        hputi4(pcVar31,"NAXIS1",iVar24);
        hputcom(pcVar31,"NAXIS1","IRAF .imh image naxis[1]");
        if ((int)uVar40 < 2) {
          pcVar38 = pcVar31 + 0x140;
          iVar27 = extraout_EDX;
LAB_001cacc5:
          bVar22 = false;
          bVar43 = false;
        }
        else {
          iVar24 = irafgeti4(pcVar29,iVar27 + 0x1a);
          hputi4(pcVar31,"NAXIS2",iVar24);
          hputcom(pcVar31,"NAXIS2","IRAF .imh image naxis[2]");
          if (uVar40 == 2) {
            pcVar38 = pcVar31 + 400;
            iVar27 = extraout_EDX_00;
            goto LAB_001cacc5;
          }
          iVar24 = irafgeti4(pcVar29,iVar27 + 0x1e);
          hputi4(pcVar31,"NAXIS3",iVar24);
          hputcom(pcVar31,"NAXIS3","IRAF .imh image naxis[3]");
          if (uVar40 < 4) {
            pcVar38 = pcVar31 + 0x1e0;
            bVar43 = true;
            bVar22 = false;
            iVar27 = extraout_EDX_01;
          }
          else {
            iVar27 = irafgeti4(pcVar29,iVar27 + 0x22);
            hputi4(pcVar31,"NAXIS4",iVar27);
            hputcom(pcVar31,"NAXIS4","IRAF .imh image naxis[4]");
            pcVar38 = pcVar31 + 0x230;
            bVar22 = true;
            bVar43 = true;
            iVar27 = extraout_EDX_02;
          }
        }
        if ((int)local_1f0 == 2) {
          pcVar32 = irafgetc(pcVar29,0x27e,0x17f);
        }
        else {
          pcVar32 = irafgetc2(pcVar29,0x2dc,iVar27);
        }
        iVar27 = (int)local_200 * 2;
        local_1bc = uVar40;
        sVar33 = strlen(pcVar32);
        if ((int)sVar33 < 8) {
          for (lVar30 = (long)(int)sVar33; lVar30 != 8; lVar30 = lVar30 + 1) {
            pcVar32[lVar30] = ' ';
          }
          pcVar32[8] = '\0';
        }
        hputs(pcVar31,"OBJECT",pcVar32);
        hputcom(pcVar31,"OBJECT","IRAF .imh title");
        free(pcVar32);
        iVar24 = irafgeti4(pcVar29,iVar27 + 0x32U);
        hputi4(pcVar31,"NPAXIS1",iVar24);
        hputcom(pcVar31,"NPAXIS1","IRAF .imh physical naxis[1]");
        if ((int)local_1bc < 2) {
          pcVar38 = pcVar38 + 0xa0;
        }
        else {
          iVar24 = irafgeti4(pcVar29,iVar27 + 0x36);
          hputi4(pcVar31,"NPAXIS2",iVar24);
          hputcom(pcVar31,"NPAXIS2","IRAF .imh physical naxis[2]");
          pcVar38 = pcVar38 + 0xf0;
        }
        if (bVar43) {
          iVar24 = irafgeti4(pcVar29,iVar27 + 0x32U | 8);
          hputi4(pcVar31,"NPAXIS3",iVar24);
          hputcom(pcVar31,"NPAXIS3","IRAF .imh physical naxis[3]");
          pcVar38 = pcVar38 + 0x50;
        }
        if (bVar22) {
          iVar27 = irafgeti4(pcVar29,iVar27 + 0x3e);
          hputi4(pcVar31,"NPAXIS4",iVar27);
          hputcom(pcVar31,"NPAXIS4","IRAF .imh physical naxis[4]");
          pcVar38 = pcVar38 + 0x50;
        }
        hputs(pcVar31,"IMHFILE",filename);
        hputcom(pcVar31,"IMHFILE","IRAF header file name");
        if ((int)local_1f0 == 2) {
          pcVar32 = irafgetc(pcVar29,0x7e,0xff);
        }
        else {
          pcVar32 = irafgetc2(pcVar29,0x19c,nc_00);
        }
        if ((((*pcVar32 == 'H') && (pcVar32[1] == 'D')) && (pcVar32[2] == 'R')) &&
           (pcVar34 = same_path(pcVar32,filename), pcVar34 != (char *)0x0)) {
          free(pcVar32);
          pcVar32 = pcVar34;
        }
        iVar27 = (int)local_200;
        pcVar34 = strchr(pcVar32,0x2f);
        if (((pcVar34 == (char *)0x0) && (pcVar34 = strchr(pcVar32,0x24), pcVar34 == (char *)0x0))
           && (pcVar34 = same_path(pcVar32,filename), pcVar34 != (char *)0x0)) {
          free(pcVar32);
          pcVar32 = pcVar34;
        }
        pcVar35 = strchr(pcVar32,0x21);
        pcVar34 = pcVar35 + 1;
        if (pcVar35 == (char *)0x0) {
          pcVar34 = pcVar32;
        }
        hputs(pcVar31,"PIXFILE",pcVar34);
        free(pcVar32);
        hputcom(pcVar31,"PIXFILE","IRAF .pix pixel file");
        iVar27 = irafgeti4(pcVar29,iVar27 * 2 + 0x56);
        hputi4(pcVar31,"PIXOFF",iVar27 * 2 + -2);
        hputcom(pcVar31,"PIXOFF","IRAF .pix pixel offset (Do not change!)");
        iVar27 = (int)local_1f0;
        hputi4(pcVar31,"IMHVER",(int)local_1f0);
        hputcom(pcVar31,"IMHVER","IRAF .imh format version (1 or 2)");
        hputl(pcVar31,"PIXSWAP",(uint)(swapdata != 0));
        hputcom(pcVar31,"PIXSWAP","IRAF pixels, FITS byte orders differ if T");
        pcVar38 = pcVar38 + 400;
        if (iVar27 == 2) {
          for (lVar30 = 0; lVar30 != 0x50; lVar30 = lVar30 + 1) {
            local_198[lVar30] = ' ';
          }
          iVar27 = 0;
          for (lVar30 = 0x7fe; lVar30 < lenirafhead; lVar30 = lVar30 + 1) {
            cVar1 = pcVar29[lVar30];
            if (cVar1 == '\n') {
              strncpy(pcVar38,local_198,0x50);
              iVar27 = bcmp(local_198,"OBJECT ",7);
              for (lVar36 = 0; lVar36 != 0x50; lVar36 = lVar36 + 1) {
                local_198[lVar36] = ' ';
              }
              if (iVar27 != 0) {
                pcVar38 = pcVar38 + 0x50;
              }
              iVar27 = 0;
            }
            else {
              if (cVar1 == '\0') break;
              if (0x50 < iVar27) {
                iVar24 = bcmp(local_198,"OBJECT ",7);
                if (iVar24 != 0) {
                  strncpy(pcVar38,local_198,0x50);
                  pcVar38 = pcVar38 + 0x50;
                  iVar27 = 9;
                }
                for (lVar36 = 0; lVar36 != 0x50; lVar36 = lVar36 + 1) {
                  local_198[lVar36] = ' ';
                }
              }
              if ((byte)(cVar1 - 0x21U) < 0x5e) {
                local_198[iVar27] = cVar1;
              }
              iVar27 = iVar27 + 1;
            }
          }
        }
        else {
          for (lVar30 = 0; lVar30 != 0x50; lVar30 = lVar30 + 1) {
            local_198[lVar30] = ' ';
          }
          bVar43 = swaphead != 1;
          iVar27 = 0;
          for (uVar41 = 0x804; (long)uVar41 < (long)lenirafhead; uVar41 = uVar41 + 2) {
            cVar1 = pcVar29[uVar41 | bVar43];
            if (cVar1 == '\n') {
              iVar27 = bcmp(local_198,"OBJECT ",7);
              if (iVar27 != 0) {
                strncpy(pcVar38,local_198,0x50);
                pcVar38 = pcVar38 + 0x50;
              }
              for (lVar30 = 0; lVar30 != 0x50; lVar30 = lVar30 + 1) {
                local_198[lVar30] = ' ';
              }
              iVar27 = 0;
            }
            else {
              if (cVar1 == '\0') break;
              if (0x50 < iVar27) {
                iVar24 = bcmp(local_198,"OBJECT ",7);
                if (iVar24 != 0) {
                  strncpy(pcVar38,local_198,0x50);
                  pcVar38 = pcVar38 + 0x50;
                  iVar27 = 9;
                }
                for (lVar30 = 0; lVar30 != 0x50; lVar30 = lVar30 + 1) {
                  local_198[lVar30] = ' ';
                }
              }
              if ((byte)(cVar1 - 0x21U) < 0x5e) {
                local_198[iVar27] = cVar1;
              }
              iVar27 = iVar27 + 1;
            }
          }
        }
        strncpy(pcVar38,pixname,0x50);
        pcVar31 = local_1a8;
        pcVar38 = ksearch(local_1a8,"END");
        filesize = local_1f8;
        pcVar38 = pcVar38 + 0x50;
        uVar41 = *local_1d0;
        auVar45._8_8_ = 0;
        auVar45._0_8_ = uVar41;
        *local_1f8 = (long)pcVar38 - (long)pcVar31;
        pixname[2] = ' ';
        pixname[0] = ' ';
        pixname[1] = ' ';
        for (; pcVar38 < pcVar31 + ((int)uVar41 - SUB164(auVar45 % ZEXT816(0xb40),0));
            pcVar38 = pcVar38 + 0x50) {
          strncpy(pcVar38,pixname,0x50);
        }
        iVar27 = *local_1e8;
        status = local_1e8;
        goto LAB_001caa9d;
      }
      snprintf(local_198,0x51,"Unsupported IRAF data type: %d",(ulong)uVar26);
      ffpmsg(local_198);
      ffpmsg(filename);
    }
    *status = 0x68;
    filesize = local_1f8;
  }
LAB_001caa9d:
  free(pcVar29);
  if (0 < iVar27) {
    return iVar27;
  }
  *filesize = (*filesize - (*filesize - 1) % 0xb40) + 0xb3f;
  iVar27 = 1;
  lpixhead = 0;
  pcVar29 = *local_1c8;
  naxis2 = iVar27;
  npaxis1 = iVar27;
  naxis3 = iVar27;
  naxis1 = iVar27;
  naxis4 = iVar27;
  nax = iVar27;
  pcVar31 = hgetc(pcVar29,"PIXFILE");
  if (pcVar31 != (char *)0x0) {
    sVar33 = strlen(pcVar31);
    if ((int)sVar33 < 0xff) {
      strcpy(pixname,pcVar31);
    }
    else {
      strncpy(pixname,pcVar31,0xfe);
      pixname[0xfe] = '\0';
    }
  }
  hgeti4(pcVar29,"PIXOFF",&lpixhead);
  pcVar38 = strchr(pixname,0x21);
  pcVar31 = pcVar38 + 1;
  if (pcVar38 == (char *)0x0) {
    pcVar31 = pixname;
  }
  __stream = fopen(pcVar31,"rb");
  iVar24 = lpixhead;
  if (__stream == (FILE *)0x0) {
    pcVar29 = "IRAFRIMAGE: Cannot open IRAF pixel file:";
LAB_001cac13:
    ffpmsg(pcVar29);
    ffpmsg(pixname);
    local_1e8 = status;
  }
  else {
    sVar33 = (size_t)lpixhead;
    pcVar31 = (char *)calloc(sVar33,1);
    if (pcVar31 == (char *)0x0) {
      ffpmsg("IRAFRIMAGE: Cannot alloc memory for pixel header");
      ffpmsg(pixname);
    }
    else {
      sVar33 = fread(pcVar31,1,sVar33,__stream);
      if ((int)sVar33 < iVar24) {
        snprintf(local_198,0x51,"IRAF pixel file: %d / %d bytes read.",sVar33 & 0xffffffff,0x400);
        ffpmsg(local_198);
        free(pcVar31);
      }
      else {
        iVar24 = irafncmp(pcVar31,"impix",nc);
        if ((iVar24 == 0) || (iVar24 = strncmp(pcVar31,"impv2",5), iVar24 == 0)) {
          free(pcVar31);
          hgeti4(pcVar29,"NAXIS",&nax);
          hgeti4(pcVar29,"NAXIS1",&naxis1);
          hgeti4(pcVar29,"NPAXIS1",&npaxis1);
          iVar24 = nax;
          local_1f8 = filesize;
          local_1e8 = status;
          if (1 < nax) {
            hgeti4(pcVar29,"NAXIS2",&naxis2);
            hgeti4(pcVar29,"NPAXIS2",&npaxis2);
            if ((iVar24 != 2) && (hgeti4(pcVar29,"NAXIS3",&naxis3), 3 < (uint)iVar24)) {
              hgeti4(pcVar29,"NAXIS4",&naxis4);
              iVar27 = naxis4;
            }
          }
          hgeti4(pcVar29,"BITPIX",&bitpix);
          ppcVar23 = local_1c8;
          iVar28 = naxis1;
          iVar25 = naxis3;
          iVar24 = naxis2;
          uVar40 = -bitpix;
          if (0 < bitpix) {
            uVar40 = bitpix;
          }
          iVar39 = (uVar40 >> 3) * naxis1;
          iVar27 = iVar27 * naxis2 * naxis3 * iVar39;
          local_200 = CONCAT44(local_200._4_4_,iVar27);
          local_1f0 = (size_t)iVar27;
          uVar41 = (*local_1f8 + local_1f0) - 1;
          uVar41 = (uVar41 - uVar41 % 0xb40) + 0xb40;
          if ((uVar41 <= *local_1d0) ||
             (pcVar29 = (char *)realloc(*local_1c8,uVar41), pcVar29 != (char *)0x0)) {
            sVar33 = local_1f0;
            *ppcVar23 = pcVar29;
            *local_1d0 = uVar41;
            string = (ulong *)(pcVar29 + *local_1f8);
            *local_1f8 = uVar41;
            iVar28 = npaxis1 - iVar28;
            if (iVar28 == 0) {
              sVar37 = fread(string,1,local_1f0,__stream);
              uVar26 = (uint)sVar37;
              uVar40 = (uint)local_200;
            }
            else {
              if (1 < iVar25 && iVar24 == 1) {
                naxis2 = iVar25;
                iVar24 = iVar25;
              }
              uVar26 = 0;
              puVar42 = string;
              for (iVar27 = 0; iVar27 < iVar24; iVar27 = iVar27 + 1) {
                sVar33 = fread(puVar42,1,(long)iVar39,__stream);
                uVar26 = uVar26 + (int)sVar33;
                fseek(__stream,(long)(int)(iVar28 * (uVar40 >> 3)),1);
                puVar42 = (ulong *)((long)puVar42 + (long)iVar39);
                iVar24 = naxis2;
              }
              sVar33 = local_1f0;
              uVar40 = (uint)local_200;
            }
            fclose(__stream);
            status = local_1e8;
            if ((int)uVar40 <= (int)uVar26) {
              if (swapdata != 0) {
                switch(bitpix << 0x1c | bitpix + 0x40U >> 4) {
                case 0:
                  if (7 < (int)uVar40) {
                    puVar42 = (ulong *)(sVar33 + (long)string);
                    for (; string < puVar42; string = string + 1) {
                      uVar41 = *string;
                      auVar10._8_6_ = 0;
                      auVar10._0_8_ = uVar41;
                      auVar10[0xe] = (char)(uVar41 >> 0x38);
                      auVar11._8_4_ = 0;
                      auVar11._0_8_ = uVar41;
                      auVar11[0xc] = (char)(uVar41 >> 0x30);
                      auVar11._13_2_ = auVar10._13_2_;
                      auVar12._8_4_ = 0;
                      auVar12._0_8_ = uVar41;
                      auVar12._12_3_ = auVar11._12_3_;
                      auVar13._8_2_ = 0;
                      auVar13._0_8_ = uVar41;
                      auVar13[10] = (char)(uVar41 >> 0x28);
                      auVar13._11_4_ = auVar12._11_4_;
                      auVar14._8_2_ = 0;
                      auVar14._0_8_ = uVar41;
                      auVar14._10_5_ = auVar13._10_5_;
                      auVar15[8] = (char)(uVar41 >> 0x20);
                      auVar15._0_8_ = uVar41;
                      auVar15._9_6_ = auVar14._9_6_;
                      auVar44[7] = 0;
                      auVar44._0_7_ = auVar15._8_7_;
                      auVar18._7_8_ = 0;
                      auVar18._0_7_ = auVar15._8_7_;
                      auVar20._1_8_ = SUB158(auVar18 << 0x40,7);
                      auVar20[0] = (char)(uVar41 >> 0x18);
                      auVar20._9_6_ = 0;
                      auVar19._1_10_ = SUB1510(auVar20 << 0x30,5);
                      auVar19[0] = (char)(uVar41 >> 0x10);
                      auVar21._11_4_ = 0;
                      auVar21._0_11_ = auVar19;
                      auVar16[2] = (char)(uVar41 >> 8);
                      auVar16._0_2_ = (ushort)uVar41;
                      auVar16._3_12_ = SUB1512(auVar21 << 0x20,3);
                      auVar17._2_13_ = auVar16._2_13_;
                      auVar17._0_2_ = (ushort)uVar41 & 0xff;
                      auVar44._8_4_ = auVar17._0_4_;
                      auVar44._12_4_ = auVar19._0_4_;
                      auVar45 = pshuflw(auVar44,auVar44,0x1b);
                      auVar45 = pshufhw(auVar45,auVar45,0x1b);
                      sVar2 = auVar45._0_2_;
                      sVar3 = auVar45._2_2_;
                      sVar4 = auVar45._4_2_;
                      sVar5 = auVar45._6_2_;
                      sVar6 = auVar45._8_2_;
                      sVar7 = auVar45._10_2_;
                      sVar8 = auVar45._12_2_;
                      sVar9 = auVar45._14_2_;
                      *string = CONCAT17((0 < sVar9) * (sVar9 < 0x100) * auVar45[0xe] -
                                         (0xff < sVar9),
                                         CONCAT16((0 < sVar8) * (sVar8 < 0x100) * auVar45[0xc] -
                                                  (0xff < sVar8),
                                                  CONCAT15((0 < sVar7) * (sVar7 < 0x100) *
                                                           auVar45[10] - (0xff < sVar7),
                                                           CONCAT14((0 < sVar6) * (sVar6 < 0x100) *
                                                                    auVar45[8] - (0xff < sVar6),
                                                                    CONCAT13((0 < sVar5) *
                                                                             (sVar5 < 0x100) *
                                                                             auVar45[6] -
                                                                             (0xff < sVar5),
                                                                             CONCAT12((0 < sVar4) *
                                                                                      (sVar4 < 0x100
                                                                                      ) * auVar45[4]
                                                                                      - (0xff < 
                                                  sVar4),CONCAT11((0 < sVar3) * (sVar3 < 0x100) *
                                                                  auVar45[2] - (0xff < sVar3),
                                                                  (0 < sVar2) * (sVar2 < 0x100) *
                                                                  auVar45[0] - (0xff < sVar2))))))))
                      ;
                    }
                  }
                  break;
                case 2:
                case 6:
                  if (3 < (int)uVar40) {
                    irafswap4((char *)string,uVar40);
                  }
                  break;
                case 3:
                case 5:
                  if (1 < (int)uVar40) {
                    irafswap2((char *)string,uVar40);
                  }
                }
              }
              goto switchD_001cb5b5_caseD_1;
            }
            pcVar29 = local_198;
            snprintf(pcVar29,0x51,"IRAF pixel file: %d / %d bytes read.",(ulong)uVar26,(ulong)uVar40
                    );
            goto LAB_001cac13;
          }
          snprintf(local_198,0x51,"IRAFRIMAGE Cannot allocate %d-byte image buffer",
                   (ulong)(uint)*local_1f8);
          ffpmsg(local_198);
          ffpmsg(pixname);
          fclose(__stream);
          goto LAB_001cac9e;
        }
        ffpmsg("File not valid IRAF pixel file:");
        ffpmsg(pixname);
        free(pcVar31);
      }
    }
    fclose(__stream);
    local_1e8 = status;
  }
LAB_001cac9e:
  *local_1e8 = 0x68;
  status = local_1e8;
switchD_001cb5b5_caseD_1:
  return *status;
}

Assistant:

int iraf2mem(char *filename,     /* name of input file                 */
             char **buffptr,     /* O - memory pointer (initially NULL)    */
             size_t *buffsize,   /* O - size of mem buffer, in bytes        */
             size_t *filesize,   /* O - size of FITS file, in bytes         */
             int *status)        /* IO - error status                       */

/*
   Driver routine that reads an IRAF image into memory, also converting
   it into FITS format.
*/
{
    char *irafheader;
    int lenirafhead;

    *buffptr = NULL;
    *buffsize = 0;
    *filesize = 0;

    /* read IRAF header into dynamically created char array (free it later!) */
    irafheader = irafrdhead(filename, &lenirafhead);

    if (!irafheader)
    {
	return(*status = FILE_NOT_OPENED);
    }

    /* convert IRAF header to FITS header in memory */
    iraftofits(filename, irafheader, lenirafhead, buffptr, buffsize, filesize,
               status);

    /* don't need the IRAF header any more */
    free(irafheader);

    if (*status > 0)
       return(*status);

    *filesize = (((*filesize - 1) / 2880 ) + 1 ) * 2880; /* multiple of 2880 */

    /* append the image data onto the FITS header */
    irafrdimage(buffptr, buffsize, filesize, status);

    return(*status);
}